

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

Dollar * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Dollar>(Allocator *this,Dollar *ast)

{
  size_t *psVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  p_Var5 = (_List_node_base *)operator_new(0x80);
  p_Var5->_M_next = (_List_node_base *)&PTR__AST_00236cd0;
  p_Var5->_M_prev = (_List_node_base *)&p_Var5[1]._M_prev;
  pcVar2 = (ast->super_AST).location.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&p_Var5->_M_prev,pcVar2,
             pcVar2 + (ast->super_AST).location.file._M_string_length);
  p_Var6 = (_List_node_base *)(ast->super_AST).location.begin.line;
  p_Var3 = (_List_node_base *)(ast->super_AST).location.begin.column;
  p_Var4 = (_List_node_base *)(ast->super_AST).location.end.column;
  p_Var5[3]._M_prev = (_List_node_base *)(ast->super_AST).location.end.line;
  p_Var5[4]._M_next = p_Var4;
  p_Var5[2]._M_prev = p_Var6;
  p_Var5[3]._M_next = p_Var3;
  *(ASTType *)&p_Var5[4]._M_prev = (ast->super_AST).type;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)(p_Var5 + 5),&(ast->super_AST).openFodder);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)&p_Var5[6]._M_prev,&(ast->super_AST).freeVariables);
  p_Var5->_M_next = (_List_node_base *)&PTR__AST_002370a8;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = p_Var5;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (Dollar *)p_Var5;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }